

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,StringTree *first,StringTree *rest,
          ArrayPtr<const_char> *rest_1,String *rest_2,ArrayPtr<const_char> *rest_3,
          ArrayPtr<const_char> *rest_4,ArrayPtr<const_char> *rest_5,ArrayPtr<const_char> *rest_6,
          ArrayPtr<const_char> *rest_7,ArrayPtr<const_char> *rest_8,ArrayPtr<const_char> *rest_9,
          String *rest_10,ArrayPtr<const_char> *rest_11,CappedArray<char,_14UL> *rest_12,
          ArrayPtr<const_char> *rest_13,ArrayPtr<const_char> *rest_14,ArrayPtr<const_char> *rest_15,
          ArrayPtr<const_char> *rest_16,StringTree *rest_17,ArrayPtr<const_char> *rest_18,
          String *rest_19,ArrayPtr<const_char> *rest_20,ArrayPtr<const_char> *rest_21,
          ArrayPtr<const_char> *rest_22,ArrayPtr<const_char> *rest_23,ArrayPtr<const_char> *rest_24,
          ArrayPtr<const_char> *rest_25,ArrayPtr<const_char> *rest_26,String *rest_27,
          ArrayPtr<const_char> *rest_28,CappedArray<char,_14UL> *rest_29,
          ArrayPtr<const_char> *rest_30,ArrayPtr<const_char> *rest_31,ArrayPtr<const_char> *rest_32,
          ArrayPtr<const_char> *rest_33,StringTree *rest_34,ArrayPtr<const_char> *rest_35,
          ArrayPtr<const_char> *rest_36,ArrayPtr<const_char> *rest_37,ArrayPtr<const_char> *rest_38,
          ArrayPtr<const_char> *rest_39,String *rest_40,ArrayPtr<const_char> *rest_41,
          ArrayPtr<const_char> *rest_42,ArrayPtr<const_char> *rest_43,String *rest_44,
          ArrayPtr<const_char> *rest_45,CappedArray<char,_14UL> *rest_46,
          ArrayPtr<const_char> *rest_47,ArrayPtr<const_char> *rest_48,ArrayPtr<const_char> *rest_49,
          ArrayPtr<const_char> *rest_50)

{
  char *pcVar1;
  Branch *pBVar2;
  StringTree *pSVar3;
  ArrayPtr<const_char> *rest_51;
  String *rest_1_00;
  ArrayPtr<const_char> *rest_2_00;
  ArrayPtr<const_char> *rest_3_00;
  ArrayPtr<const_char> *rest_4_00;
  ArrayPtr<const_char> *rest_5_00;
  ArrayPtr<const_char> *rest_6_00;
  ArrayPtr<const_char> *rest_7_00;
  ArrayPtr<const_char> *rest_8_00;
  String *rest_9_00;
  ArrayPtr<const_char> *rest_10_00;
  CappedArray<char,_14UL> *rest_11_00;
  ArrayPtr<const_char> *rest_12_00;
  ArrayPtr<const_char> *rest_13_00;
  ArrayPtr<const_char> *rest_14_00;
  ArrayPtr<const_char> *rest_15_00;
  StringTree *rest_16_00;
  ArrayPtr<const_char> *rest_17_00;
  String *rest_18_00;
  ArrayPtr<const_char> *rest_19_00;
  ArrayPtr<const_char> *rest_20_00;
  ArrayPtr<const_char> *rest_21_00;
  ArrayPtr<const_char> *rest_22_00;
  ArrayPtr<const_char> *rest_23_00;
  ArrayPtr<const_char> *rest_24_00;
  ArrayPtr<const_char> *rest_25_00;
  String *rest_26_00;
  ArrayPtr<const_char> *rest_27_00;
  CappedArray<char,_14UL> *rest_28_00;
  ArrayPtr<const_char> *rest_29_00;
  ArrayPtr<const_char> *rest_30_00;
  ArrayPtr<const_char> *rest_31_00;
  ArrayPtr<const_char> *rest_32_00;
  StringTree *rest_33_00;
  ArrayPtr<const_char> *rest_34_00;
  ArrayPtr<const_char> *rest_35_00;
  ArrayPtr<const_char> *rest_36_00;
  ArrayPtr<const_char> *rest_37_00;
  ArrayPtr<const_char> *rest_38_00;
  String *rest_39_00;
  ArrayPtr<const_char> *rest_40_00;
  ArrayPtr<const_char> *rest_41_00;
  ArrayPtr<const_char> *rest_42_00;
  String *rest_43_00;
  ArrayPtr<const_char> *rest_44_00;
  CappedArray<char,_14UL> *rest_45_00;
  ArrayPtr<const_char> *rest_46_00;
  ArrayPtr<const_char> *rest_47_00;
  ArrayPtr<const_char> *rest_48_00;
  ArrayPtr<const_char> *rest_49_00;
  ArrayPtr<const_char> *rest_local_1;
  StringTree *rest_local;
  StringTree *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pcVar1 = String::begin(&this->text);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  pBVar2->index = (long)pos - (long)pcVar1;
  pSVar3 = mv<kj::StringTree>(first);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  operator=(&pBVar2->content,pSVar3);
  pSVar3 = fwd<kj::StringTree>(rest);
  rest_51 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  rest_1_00 = fwd<kj::String>(rest_2);
  rest_2_00 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  rest_3_00 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  rest_4_00 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  rest_5_00 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  rest_6_00 = fwd<kj::ArrayPtr<char_const>>(rest_7);
  rest_7_00 = fwd<kj::ArrayPtr<char_const>>(rest_8);
  rest_8_00 = fwd<kj::ArrayPtr<char_const>>(rest_9);
  rest_9_00 = fwd<kj::String>(rest_10);
  rest_10_00 = fwd<kj::ArrayPtr<char_const>>(rest_11);
  rest_11_00 = fwd<kj::CappedArray<char,14ul>>(rest_12);
  rest_12_00 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  rest_13_00 = fwd<kj::ArrayPtr<char_const>>(rest_14);
  rest_14_00 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  rest_15_00 = fwd<kj::ArrayPtr<char_const>>(rest_16);
  rest_16_00 = fwd<kj::StringTree>(rest_17);
  rest_17_00 = fwd<kj::ArrayPtr<char_const>>(rest_18);
  rest_18_00 = fwd<kj::String>(rest_19);
  rest_19_00 = fwd<kj::ArrayPtr<char_const>>(rest_20);
  rest_20_00 = fwd<kj::ArrayPtr<char_const>>(rest_21);
  rest_21_00 = fwd<kj::ArrayPtr<char_const>>(rest_22);
  rest_22_00 = fwd<kj::ArrayPtr<char_const>>(rest_23);
  rest_23_00 = fwd<kj::ArrayPtr<char_const>>(rest_24);
  rest_24_00 = fwd<kj::ArrayPtr<char_const>>(rest_25);
  rest_25_00 = fwd<kj::ArrayPtr<char_const>>(rest_26);
  rest_26_00 = fwd<kj::String>(rest_27);
  rest_27_00 = fwd<kj::ArrayPtr<char_const>>(rest_28);
  rest_28_00 = fwd<kj::CappedArray<char,14ul>>(rest_29);
  rest_29_00 = fwd<kj::ArrayPtr<char_const>>(rest_30);
  rest_30_00 = fwd<kj::ArrayPtr<char_const>>(rest_31);
  rest_31_00 = fwd<kj::ArrayPtr<char_const>>(rest_32);
  rest_32_00 = fwd<kj::ArrayPtr<char_const>>(rest_33);
  rest_33_00 = fwd<kj::StringTree>(rest_34);
  rest_34_00 = fwd<kj::ArrayPtr<char_const>>(rest_35);
  rest_35_00 = fwd<kj::ArrayPtr<char_const>>(rest_36);
  rest_36_00 = fwd<kj::ArrayPtr<char_const>>(rest_37);
  rest_37_00 = fwd<kj::ArrayPtr<char_const>>(rest_38);
  rest_38_00 = fwd<kj::ArrayPtr<char_const>>(rest_39);
  rest_39_00 = fwd<kj::String>(rest_40);
  rest_40_00 = fwd<kj::ArrayPtr<char_const>>(rest_41);
  rest_41_00 = fwd<kj::ArrayPtr<char_const>>(rest_42);
  rest_42_00 = fwd<kj::ArrayPtr<char_const>>(rest_43);
  rest_43_00 = fwd<kj::String>(rest_44);
  rest_44_00 = fwd<kj::ArrayPtr<char_const>>(rest_45);
  rest_45_00 = fwd<kj::CappedArray<char,14ul>>(rest_46);
  rest_46_00 = fwd<kj::ArrayPtr<char_const>>(rest_47);
  rest_47_00 = fwd<kj::ArrayPtr<char_const>>(rest_48);
  rest_48_00 = fwd<kj::ArrayPtr<char_const>>(rest_49);
  rest_49_00 = fwd<kj::ArrayPtr<char_const>>(rest_50);
  fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,pSVar3,rest_51,rest_1_00,rest_2_00,rest_3_00,rest_4_00,
             rest_5_00,rest_6_00,rest_7_00,rest_8_00,rest_9_00,rest_10_00,rest_11_00,rest_12_00,
             rest_13_00,rest_14_00,rest_15_00,rest_16_00,rest_17_00,rest_18_00,rest_19_00,rest_20_00
             ,rest_21_00,rest_22_00,rest_23_00,rest_24_00,rest_25_00,rest_26_00,rest_27_00,
             rest_28_00,rest_29_00,rest_30_00,rest_31_00,rest_32_00,rest_33_00,rest_34_00,rest_35_00
             ,rest_36_00,rest_37_00,rest_38_00,rest_39_00,rest_40_00,rest_41_00,rest_42_00,
             rest_43_00,rest_44_00,rest_45_00,rest_46_00,rest_47_00,rest_48_00,rest_49_00);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}